

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# store.c
# Opt level: O0

store * store_at(chunk *c,loc_conflict grid)

{
  wchar_t wVar1;
  _Bool _Var2;
  wchar_t wVar3;
  int local_34;
  town_conflict *ptStack_30;
  wchar_t i;
  town *town;
  level *lev;
  store *s;
  chunk *c_local;
  loc_conflict grid_local;
  
  lev = (level *)0x0;
  _Var2 = square_isshop(c,grid);
  if (_Var2) {
    ptStack_30 = (town_conflict *)0x0;
    local_34 = 0;
    while ((local_34 < world->num_towns &&
           (ptStack_30 = world->towns + local_34,
           ptStack_30->index != world->levels[player->place].index))) {
      local_34 = local_34 + 1;
    }
    if (local_34 < world->num_towns) {
      for (lev = (level *)ptStack_30->stores;
          (lev != (level *)0x0 &&
          (wVar1 = *(wchar_t *)&lev->north, wVar3 = square_shopnum((chunk *)cave,grid),
          wVar1 != wVar3)); lev = *(level **)lev) {
      }
    }
  }
  return (store *)lev;
}

Assistant:

struct store *store_at(struct chunk *c, struct loc grid)
{
	struct store *s = NULL;

	if (square_isshop(c, grid)) {
		struct level *lev = &world->levels[player->place];
		struct town *town = NULL;
		int i;
		for (i = 0; i < world->num_towns; i++) {
			town = &world->towns[i];
			if (town->index == lev->index) break;
		}
		if (i < world->num_towns) {
			for (s = town->stores; s; s = s->next) {
				if ((int) s->sidx == square_shopnum(cave, grid)) break;
			}
		}
	}

	return s;
}